

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSAtomStruct *pJVar1;
  JSValueUnion JVar2;
  JSRuntime *pJVar3;
  uint uVar4;
  JSValue getter;
  JSValue setter;
  uint32_t *puVar5;
  JSAtom atom;
  JSRefCountHeader *p;
  JSValue JVar6;
  JSValue JVar7;
  uint uStack_4c;
  uint uStack_3c;
  
  if (argc == 0) {
    JVar2 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
    *(int *)JVar2.ptr = *JVar2.ptr + 1;
    JVar6.tag = -7;
    JVar6.u.ptr = JVar2.ptr;
  }
  else {
    if ((argv->tag & 0xffffffffU) == 0xfffffff8 && (new_target.tag & 0xffffffffU) == 3) {
      pJVar1 = (JSAtomStruct *)(argv->u).ptr;
      uVar4 = (uint)((ulong)*(undefined8 *)&pJVar1->field_0x4 >> 0x20);
      if (uVar4 >> 0x1e < 3) {
        pJVar3 = ctx->rt;
        puVar5 = (uint32_t *)
                 ((ulong)((pJVar3->atom_hash_size - 1U & uVar4) << 2) + (long)pJVar3->atom_hash);
        do {
          atom = *puVar5;
          puVar5 = &pJVar3->atom_array[atom]->hash_next;
        } while (pJVar3->atom_array[atom] != pJVar1);
      }
      else {
        atom = pJVar1->hash_next;
      }
      JVar6 = __JS_AtomToValue(ctx,atom,1);
      JVar6 = JS_ConcatString3(ctx,"Symbol(",JVar6,")");
    }
    else {
      JVar7.tag = argv->tag;
      JVar7.u.ptr = (argv->u).ptr;
      JVar6 = JS_ToStringInternal(ctx,JVar7,0);
    }
    if ((int)JVar6.tag == 6) {
      return JVar6;
    }
  }
  JVar7 = JVar6;
  if (((int)new_target.tag != 3) &&
     (JVar7 = js_create_from_ctor(ctx,new_target,5), (int)JVar7.tag != 6)) {
    JS_SetObjectData(ctx,JVar7,JVar6);
    getter.tag = 3;
    getter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
    setter.tag = 3;
    setter.u.ptr = (void *)((ulong)uStack_4c << 0x20);
    JS_DefineProperty(ctx,JVar7,0x30,
                      (JSValue)ZEXT416((uint)*(undefined8 *)((long)JVar6.u.ptr + 4) & 0x7fffffff),
                      getter,setter,0x2700);
  }
  return JVar7;
}

Assistant:

static JSValue js_string_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue val, obj;
    if (argc == 0) {
        val = JS_AtomToString(ctx, JS_ATOM_empty_string);
    } else {
        if (JS_IsUndefined(new_target) && JS_IsSymbol(argv[0])) {
            JSAtomStruct *p = JS_VALUE_GET_PTR(argv[0]);
            val = JS_ConcatString3(ctx, "Symbol(", JS_AtomToString(ctx, js_get_atom_index(ctx->rt, p)), ")");
        } else {
            val = JS_ToString(ctx, argv[0]);
        }
        if (JS_IsException(val))
            return val;
    }
    if (!JS_IsUndefined(new_target)) {
        JSString *p1 = JS_VALUE_GET_STRING(val);

        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_STRING);
        if (!JS_IsException(obj)) {
            JS_SetObjectData(ctx, obj, val);
            JS_DefinePropertyValue(ctx, obj, JS_ATOM_length, JS_NewInt32(ctx, p1->len), 0);
        }
        return obj;
    } else {
        return val;
    }
}